

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readTokenSkippingComments(OurReader *this,Token *token)

{
  bool bVar1;
  
  bVar1 = readToken(this,token);
  if ((this->features_).allowComments_ == true) {
    while ((bVar1 != false && (token->type_ == tokenComment))) {
      bVar1 = readToken(this,token);
    }
  }
  return bVar1;
}

Assistant:

bool OurReader::readTokenSkippingComments(Token& token) {
  bool success = readToken(token);
  if (features_.allowComments_) {
    while (success && token.type_ == tokenComment) {
      success = readToken(token);
    }
  }
  return success;
}